

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27927a::CliqueRunner::post_nogood
          (CliqueRunner *this,vector<int,_std::allocator<int>_> *c)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Nogood<int> nogood;
  undefined1 local_28 [16];
  _List_node_base *local_18;
  
  local_28 = ZEXT816(0);
  local_18 = (_List_node_base *)0x0;
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)local_28,
             (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  p_Var2 = (_List_node_base *)operator_new(0x28);
  p_Var2[1]._M_next = (_List_node_base *)local_28._0_8_;
  p_Var2[1]._M_prev = (_List_node_base *)local_28._8_8_;
  p_Var2[2]._M_next = local_18;
  local_28 = ZEXT816(0) << 0x20;
  local_18 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->watches).nogoods.
            super__List_base<gss::innards::Nogood<int>,_std::allocator<gss::innards::Nogood<int>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (this->watches).nogoods.
           super__List_base<gss::innards::Nogood<int>,_std::allocator<gss::innards::Nogood<int>_>_>.
           _M_impl._M_node.super__List_node_base._M_prev;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->watches).need_to_watch.
            super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((void *)local_28._0_8_ != (void *)0x0) {
    operator_delete((void *)local_28._0_8_,(long)local_18 - local_28._0_8_);
  }
  return;
}

Assistant:

auto post_nogood(
            const vector<int> & c)
        {
            Nogood<int> nogood;
            nogood.literals.assign(c.begin(), c.end());
            watches.post_nogood(move(nogood));
        }